

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

int Gia_ManHashAnd(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *p1;
  uint *puVar6;
  
  if (iLit0 < 2) {
    uVar4 = iLit1;
    if (iLit0 == 0) {
      uVar4 = iLit0;
    }
  }
  else if (iLit1 < 2) {
    uVar4 = iLit0;
    if (iLit1 == 0) {
      uVar4 = iLit1;
    }
  }
  else {
    uVar4 = iLit0;
    if ((iLit0 != iLit1) && (uVar4 = 0, (iLit1 ^ iLit0) != 1)) {
      if (p->fGiaSimple != 0) {
        if ((p->vHTable).nSize != 0) {
          __assert_fail("Vec_IntSize(&p->vHTable) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                        ,0x24c,"int Gia_ManHashAnd(Gia_Man_t *, int, int)");
        }
        iVar3 = Gia_ManAppendAnd(p,iLit0,iLit1);
        return iVar3;
      }
      if (((char)p->nObjs == '\0') &&
         ((p->vHTable).nSize * 2 < p->nObjs + ~(p->vCos->nSize + p->vCis->nSize))) {
        Gia_ManHashResize(p);
      }
      if (p->fAddStrash != 0) {
        pGVar5 = Gia_ObjFromLit(p,iLit0);
        p1 = Gia_ObjFromLit(p,iLit1);
        pGVar5 = Gia_ManAddStrash(p,pGVar5,p1);
        if (pGVar5 != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ObjToLit(p,pGVar5);
          return iVar3;
        }
      }
      iVar3 = iLit1;
      if ((uint)iLit0 >= (uint)iLit1 && iLit0 != iLit1) {
        iVar3 = iLit0;
      }
      if ((uint)iLit0 < (uint)iLit1) {
        iLit1 = iLit0;
      }
      puVar6 = (uint *)Gia_ManHashFind(p,iLit1,iVar3,-1);
      uVar4 = *puVar6;
      if (uVar4 == 0) {
        p->nHashMiss = p->nHashMiss + 1;
        iVar1 = (p->vHash).nSize;
        iVar2 = (p->vHash).nCap;
        uVar4 = Gia_ManAppendAnd(p,iLit1,iVar3);
        if ((iVar2 <= iVar1) && (puVar6 = (uint *)Gia_ManHashFind(p,iLit1,iVar3,-1), *puVar6 != 0))
        {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                        ,0x267,"int Gia_ManHashAnd(Gia_Man_t *, int, int)");
        }
        if ((int)uVar4 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        *puVar6 = uVar4 >> 1;
        uVar4 = uVar4 & 0xfffffffe;
      }
      else {
        p->nHashHit = p->nHashHit + 1;
        if ((int)uVar4 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar4 = uVar4 * 2;
      }
    }
  }
  return uVar4;
}

Assistant:

int Gia_ManHashAnd( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( iLit0 < 2 )
        return iLit0 ? iLit1 : 0;
    if ( iLit1 < 2 )
        return iLit1 ? iLit0 : 0;
    if ( iLit0 == iLit1 )
        return iLit1;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 0;
    if ( p->fGiaSimple )
    {
        assert( Vec_IntSize(&p->vHTable) == 0 );
        return Gia_ManAppendAnd( p, iLit0, iLit1 );
    }
    if ( (p->nObjs & 0xFF) == 0 && 2 * Vec_IntSize(&p->vHTable) < Gia_ManAndNum(p) )
        Gia_ManHashResize( p );
    if ( p->fAddStrash )
    {
        Gia_Obj_t * pObj = Gia_ManAddStrash( p, Gia_ObjFromLit(p, iLit0), Gia_ObjFromLit(p, iLit1) );
        if ( pObj != NULL )
            return Gia_ObjToLit( p, pObj );
    }
    if ( iLit0 > iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    {
        int * pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, 0 );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendAnd( p, iLit0, iLit1 ) );
        else
        {
            int iNode = Gia_ManAppendAnd( p, iLit0, iLit1 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, 0 );
    }
}